

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::~ParamDict(ParamDict *this)

{
  ~ParamDict(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

ParamDict::~ParamDict()
{
    delete d;
}